

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Advect.cpp
# Opt level: O2

double __thiscall
Advect3D::interp(Advect3D *this,Field<double,_unsigned_short> *F,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  unsigned_short k;
  unsigned_short j;
  int iVar8;
  int iVar9;
  double *pdVar10;
  unsigned_short k_00;
  int iVar11;
  uint uVar12;
  unsigned_short j_00;
  uint uVar13;
  unsigned_short uVar14;
  uint uVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  uVar15 = (int)x & 0xffff;
  iVar16 = uVar15 + 1;
  iVar11 = F->_Xsize - 1;
  if (iVar16 <= iVar11) {
    iVar11 = iVar16;
  }
  uVar13 = (int)y & 0xffff;
  iVar8 = uVar13 + 1;
  iVar16 = F->_Ysize - 1;
  if (iVar8 <= iVar16) {
    iVar16 = iVar8;
  }
  uVar12 = (int)z & 0xffff;
  iVar9 = uVar12 + 1;
  iVar8 = F->_Zsize - 1;
  if (iVar9 <= iVar8) {
    iVar8 = iVar9;
  }
  dVar19 = x - (double)uVar15;
  dVar17 = y - (double)uVar13;
  dVar18 = z - (double)uVar12;
  dVar20 = 1.0 - dVar18;
  k_00 = (unsigned_short)(int)z;
  j_00 = (unsigned_short)(int)y;
  uVar14 = (unsigned_short)(int)x;
  pdVar10 = Field<double,_unsigned_short>::operator()(F,uVar14,j_00,k_00);
  k = (unsigned_short)iVar8;
  dVar1 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()(F,uVar14,j_00,k);
  dVar2 = *pdVar10;
  j = (unsigned_short)iVar16;
  pdVar10 = Field<double,_unsigned_short>::operator()(F,uVar14,j,k_00);
  dVar3 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()(F,uVar14,j,k);
  dVar4 = *pdVar10;
  uVar14 = (unsigned_short)iVar11;
  pdVar10 = Field<double,_unsigned_short>::operator()(F,uVar14,j_00,k_00);
  dVar5 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()(F,uVar14,j_00,k);
  dVar6 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()(F,uVar14,j,k_00);
  dVar7 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()(F,uVar14,j,k);
  return ((dVar6 * dVar18 + dVar5 * dVar20) * (1.0 - dVar17) +
         (dVar18 * *pdVar10 + dVar20 * dVar7) * dVar17) * dVar19 +
         ((dVar2 * dVar18 + dVar1 * dVar20) * (1.0 - dVar17) +
         (dVar4 * dVar18 + dVar3 * dVar20) * dVar17) * (1.0 - dVar19);
}

Assistant:

inline double Advect3D::interp(
        const Field<double, std::uint16_t>& F,
        const double x,
        const double y,
        const double z
    ) const
{
    const std::uint16_t i0 = static_cast<std::uint16_t>(x);
    const std::uint16_t i1 = std::clamp(i0 + 1, 1, static_cast<int>(F.x()-1));
    const std::uint16_t j0 = static_cast<std::uint16_t>(y);
    const std::uint16_t j1 = std::clamp(j0 + 1, 1, static_cast<int>(F.y()-1));
    const std::uint16_t k0 = static_cast<std::uint16_t>(z);
    const std::uint16_t k1 = std::clamp(k0 + 1, 1, static_cast<int>(F.z()-1));

    const double s1 = x - i0;
    const double s0 = 1.0 - s1;
    const double t1 = y - j0;
    const double t0 = 1.0 - t1;
    const double u1 = z - k0;
    const double u0 = 1.0 - u1;

    return s0 * (     t0 * ( u0 * F(i0, j0, k0) + u1 * F(i0, j0, k1) )
                    + t1 * ( u0 * F(i0, j1, k0) + u1 * F(i0, j1, k1) )
                )
         + s1 * (     t0 * ( u0 * F(i1, j0, k0) + u1 * F(i1, j0, k1) )
                    + t1 * ( u0 * F(i1, j1, k0) + u1 * F(i1, j1, k1) )
                );
}